

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O0

void __thiscall QEglFSCursor::changeCursor(QEglFSCursor *this,QCursor *cursor,QWindow *window)

{
  bool bVar1;
  undefined8 in_RDX;
  QRect *in_RSI;
  QEglFSCursor *in_RDI;
  long in_FS_OFFSET;
  QRect oldCursorRect;
  undefined1 in_stack_ffffffffffffffc8 [16];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.x2.m_i = -0x55555556;
  local_18.y2.m_i = -0x55555556;
  local_18.x1.m_i = -0x55555556;
  local_18.y1.m_i = -0x55555556;
  local_18 = cursorRect(in_RDI);
  bVar1 = setCurrentCursor(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  if (bVar1) {
    cursorRect(in_RDI);
    QRect::operator|(&local_18,(QRect *)&stack0xffffffffffffffc8);
    update(in_RDI,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSCursor::changeCursor(QCursor *cursor, QWindow *window)
{
    Q_UNUSED(window);
    const QRect oldCursorRect = cursorRect();
    if (setCurrentCursor(cursor))
        update(oldCursorRect | cursorRect(), false);
}